

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonsugar.hpp
# Opt level: O2

type * __thiscall
nonsugar::
parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)97,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)99,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>>
          (type *__return_storage_ptr__,nonsugar *this,
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          begin,__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                end,
          basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__a_,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__c_,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          *command,argument_order order)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  const_iterator cVar2;
  pointer pbVar3;
  __type_conflict _Var4;
  bool bVar5;
  ostream *poVar6;
  basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *extraout_RDX;
  char *s;
  char *s_00;
  char *s_01;
  char *extraout_RDX_00;
  long lVar7;
  pointer psVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *long_name;
  pointer pbVar9;
  undefined1 auVar10 [16];
  bool exact;
  bool exclusive;
  const_iterator arg_it;
  const_iterator arg_last;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  match;
  string_type name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  partial_matches;
  iterator argument_it;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  argument_args;
  iterator argument_last;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  subcommand_arg;
  sstream<string_type> ss;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  const_iterator *local_198;
  type *local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_188;
  bool *local_180;
  
  (__return_storage_ptr__->
  super_option_pair<char,__c_,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ).value.
  super___shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->
  super_option_pair<char,__c_,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ).value.
  super___shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->super_option_pair<char,__b_,_void>).value.
  super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->super_option_pair<char,__b_,_void>).value.
  super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->super_option_pair<char,__a_,_void>).value.
  super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->super_option_pair<char,__a_,_void>).value.
  super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pbVar1 = end._M_current + 2;
  _ss = (pointer)__return_storage_ptr__;
  detail::
  tuple_for_each_impl<std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)97,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>>const&,nonsugar::parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)97,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)99,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)97,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)99,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>const&,nonsugar::argument_order)::_lambda(auto:1_const&)_1_,0ul,1ul>
            (pbVar1);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args,
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )this,begin,(allocator_type *)&ss);
  arg_last._M_current =
       args.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  exclusive = false;
  subcommand_arg.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  subcommand_arg.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  argument_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  argument_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  argument_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  s = extraout_RDX;
  do {
    arg_it._M_current =
         args.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    if (args.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start == arg_last._M_current) {
LAB_00130c4c:
      if (exclusive == false) {
        _ss = (pointer)&argument_it;
        argument_it._M_current =
             argument_args.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        argument_last._M_current =
             argument_args.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_1a8._M_allocated_capacity = (size_type)__return_storage_ptr__;
        local_1a8._8_8_ = end._M_current;
        parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)97,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)99,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)97,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)99,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>const&,nonsugar::argument_order)
        ::{lambda(auto:1_const&)#8}::operator()
                  ((_lambda_auto_1_const___8_ *)&ss,
                   (argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__c_,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)((long)&end._M_current[0xc].field_2 + 8));
        if (argument_it._M_current != argument_last._M_current) {
          auVar10 = __cxa_allocate_exception(0x28);
          detail::widen<std::__cxx11::string>
                    (&name,(detail *)": unrecognized argument: ",auVar10._8_8_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&match
                         ,end._M_current,&name);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&match
                         ,argument_it._M_current);
          basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::basic_error(auVar10._0_8_,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss);
          __cxa_throw(auVar10._0_8_,&basic_error<std::__cxx11::string>::typeinfo,
                      basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~basic_error);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&argument_args);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&subcommand_arg.
                  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&args);
      return __return_storage_ptr__;
    }
    detail::widen<std::__cxx11::string>((string *)&ss,(detail *)0x14742a,s);
    _Var4 = std::operator==(args.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,(string *)&ss);
    std::__cxx11::string::~string((string *)&ss);
    cVar2 = arg_it;
    if (_Var4) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&argument_args
                 ,(const_iterator)
                  argument_args.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish,arg_it._M_current + 1,
                 (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )arg_last._M_current);
      goto LAB_00130c4c;
    }
    match.
    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    match._M_begin._M_current = (char *)0x0;
    match.
    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    match.
    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    detail::widen<std::__cxx11::string>(&name,(detail *)"--([^=]+)(?:=(.*))?",s_00);
    std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
    basic_regex<std::char_traits<char>,std::allocator<char>>
              ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&ss,&name,0x10);
    bVar5 = std::
            regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                      (cVar2._M_current,&match,
                       (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&ss,0);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&ss);
    std::__cxx11::string::~string((string *)&name);
    cVar2 = arg_it;
    if (bVar5) {
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::str(&name,&match,1);
      exact = false;
      partial_matches.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      partial_matches.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      partial_matches.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      _ss = (pointer)&name;
      local_1a8._M_allocated_capacity = (size_type)end._M_current;
      local_1a8._8_8_ = (type *)&partial_matches;
      detail::
      tuple_for_each_impl<std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)97,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>>const&,nonsugar::parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)97,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)99,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)97,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)99,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>const&,nonsugar::argument_order)::_lambda(auto:1_const&)_2_,0ul,1ul>
                (pbVar1,(string *)&ss);
      if (exact == false) {
        if (partial_matches.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            partial_matches.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          auVar10 = __cxa_allocate_exception(0x28);
          detail::widen<std::__cxx11::string>
                    ((string *)&argument_last,(detail *)": unrecognized option: --",auVar10._8_8_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &argument_it,end._M_current,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &argument_last);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &argument_it,&name);
          basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::basic_error(auVar10._0_8_,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss);
          __cxa_throw(auVar10._0_8_,&basic_error<std::__cxx11::string>::typeinfo,
                      basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~basic_error);
        }
        if (0x20 < (ulong)((long)partial_matches.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)partial_matches.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)) {
          std::__cxx11::stringstream::stringstream((stringstream *)&ss);
          poVar6 = std::operator<<((ostream *)local_1a8._M_local_buf,(string *)end._M_current);
          poVar6 = std::operator<<(poVar6,": ambiguous option: --");
          poVar6 = std::operator<<(poVar6,(string *)&name);
          std::operator<<(poVar6," [");
          pbVar3 = partial_matches.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          bVar5 = true;
          for (pbVar9 = partial_matches.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start; pbVar9 != pbVar3;
              pbVar9 = pbVar9 + 1) {
            if (!bVar5) {
              std::operator<<((ostream *)local_1a8._M_local_buf,", ");
            }
            poVar6 = std::operator<<((ostream *)local_1a8._M_local_buf,"--");
            std::operator<<(poVar6,(string *)pbVar9);
            bVar5 = false;
          }
          std::operator<<((ostream *)local_1a8._M_local_buf,"]");
          this_00 = (basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::basic_error(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&argument_it);
          __cxa_throw(this_00,&basic_error<std::__cxx11::string>::typeinfo,
                      basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~basic_error);
        }
      }
      _ss = &exact;
      local_1a8._M_allocated_capacity = (size_type)&match;
      local_198 = &arg_last;
      local_180 = &exclusive;
      local_1a8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arg_it
      ;
      local_190 = __return_storage_ptr__;
      local_188 = end._M_current;
      detail::
      tuple_for_each_impl<std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)97,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>>const&,nonsugar::parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)97,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)99,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)97,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)99,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>const&,nonsugar::argument_order)::_lambda(auto:1_const&)_3_,0ul,1ul>
                (pbVar1,(string *)&ss);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&partial_matches);
      std::__cxx11::string::~string((string *)&name);
    }
    else {
      detail::widen<std::__cxx11::string>(&name,(detail *)"-(.+)",s_01);
      std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
      basic_regex<std::char_traits<char>,std::allocator<char>>
                ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&ss,&name,0x10);
      bVar5 = std::
              regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                        (cVar2._M_current,&match,
                         (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&ss,0);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&ss);
      std::__cxx11::string::~string((string *)&name);
      if (bVar5) {
        lVar7 = (long)match.
                      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)match.
                      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        if (lVar7 != 0) {
          if (lVar7 / 0x18 - 5U < 0xfffffffffffffffe) {
            psVar8 = match.
                     super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1;
            goto LAB_00130b35;
          }
        }
        psVar8 = (pointer)((long)match.
                                 super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 .
                                 super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar7 + -0x48);
LAB_00130b35:
        argument_last._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (psVar8->
             super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ).first._M_current;
        do {
          lVar7 = (long)match.
                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)match.
                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          if (lVar7 == 0) {
LAB_00130b61:
            psVar8 = (pointer)((long)match.
                                     super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar7 + -0x48);
          }
          else {
            if (0xfffffffffffffffd < lVar7 / 0x18 - 5U) goto LAB_00130b61;
            psVar8 = match.
                     super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1;
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (psVar8->
              super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ).second._M_current == argument_last._M_current) goto LAB_00130b0b;
          partial_matches.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT71(partial_matches.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                 *(char *)&((argument_last._M_current)->_M_dataplus)._M_p);
          exact = false;
          _ss = (pointer)&partial_matches;
          local_1a8._M_allocated_capacity = (size_type)end._M_current;
          detail::
          tuple_for_each_impl<std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)97,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>>const&,nonsugar::parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)97,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)99,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)97,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)99,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>const&,nonsugar::argument_order)::_lambda(auto:1_const&)_4_,0ul,1ul>
                    (pbVar1,(string *)&ss);
          if (exact == false) {
            auVar10 = __cxa_allocate_exception(0x28);
            detail::widen<std::__cxx11::string>
                      ((string *)&argument_it,(detail *)": unrecognized option: -",auVar10._8_8_);
            std::operator+(&name,end._M_current,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &argument_it);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                           &name,(char)partial_matches.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
            basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::basic_error(auVar10._0_8_,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss);
            __cxa_throw(auVar10._0_8_,&basic_error<std::__cxx11::string>::typeinfo,
                        basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~basic_error);
          }
          local_1a8._M_allocated_capacity = (size_type)&match;
          local_198 = &arg_last;
          local_180 = &exclusive;
          _ss = (pointer)&partial_matches;
          local_1a8._8_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arg_it;
          local_190 = __return_storage_ptr__;
          local_188 = end._M_current;
          detail::
          tuple_for_each_impl<std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)97,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>>const&,nonsugar::parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)97,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)99,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)97,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)99,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>const&,nonsugar::argument_order)::_lambda(auto:1_const&)_5_,0ul,1ul>
                    (pbVar1,(string *)&ss);
          argument_last._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&((argument_last._M_current)->_M_dataplus)._M_p + 1);
        } while( true );
      }
      if ((int)command != 1) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &argument_args,
                   (const_iterator)
                   argument_args.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )arg_it._M_current,
                   (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )arg_last._M_current);
        std::
        _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)&match);
        goto LAB_00130c4c;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&argument_args,arg_it._M_current);
    }
LAB_00130b0b:
    std::
    _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)&match);
    args.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = arg_it._M_current + 1;
    s = extraout_RDX_00;
  } while( true );
}

Assistant:

inline typename detail::to_option_map<Command>::type parse(
    Iterator begin, Iterator end, Command const &command, argument_order order)
{
    using string_type = typename Command::string_type;
    using error_type = basic_error<string_type>;
    using regex_type = std::basic_regex<typename string_type::value_type>;
    auto const &_ = detail::widen<string_type>;

    typename detail::to_option_map<Command>::type opts;
    detail::tuple_for_each(command.m_flags, [&](auto const &flg)
        {
            constexpr auto option = detail::remove_cvr_t<decltype(flg)>::option();
            opts.template priv_value<option>() = flg.default_value;
        });

    std::vector<string_type> const args(begin, end);
    auto arg_it = args.begin();
    auto const arg_last = args.end();
    bool exclusive = false;

    constexpr auto subcommand_required =
        std::tuple_size<typename Command::subcommand_tuple_type>::value != 0;
    std::shared_ptr<string_type> subcommand_arg;
    std::vector<string_type> argument_args;

    for (; arg_it != arg_last; ++arg_it) {
        if (*arg_it == _("--")) {
            argument_args.insert(argument_args.end(), std::next(arg_it), arg_last);
            break;
        }
        std::match_results<typename string_type::const_iterator> match;
        if (std::regex_match(*arg_it, match, regex_type(_("--([^=]+)(?:=(.*))?")))) {
            // long flag
            auto const name = match.str(1);
            bool exact = false;
            std::vector<string_type> partial_matches;
            detail::tuple_for_each(command.m_flags, [&](auto const &flg)
                {
                    for (auto const &long_name : flg.long_names) {
                        if (name == long_name) {
                            if (std::exchange(exact, true)) {
                                throw error_type(
                                    command.m_header + _(": ambiguous option: --") + name);
                            }
                        } else if (detail::starts_with(long_name, name)) {
                            partial_matches.push_back(long_name);
                        }
                    }
                });
            if (!exact) {
                if (partial_matches.empty()) {
                    throw error_type(command.m_header + _(": unrecognized option: --") + name);
                } else if (partial_matches.size() >= 2) {
                    detail::sstream<string_type> ss;
                    ss << command.m_header << ": ambiguous option: --" << name << " [";
                    bool first = true;
                    for (auto const &long_name : partial_matches) {
                        if (!std::exchange(first, false)) ss << ", ";
                        ss << "--" << long_name;
                    }
                    ss << "]";
                    throw error_type(ss.str());
                }
            }
            detail::tuple_for_each(command.m_flags, [&](auto const &flg)
                {
                    using flag_type = detail::remove_cvr_t<decltype(flg)>;
                    using value_type = typename flag_type::value_type;
                    constexpr auto option = flag_type::option();
                    for (auto const &long_name : flg.long_names) {
                        if (exact ? name == long_name : detail::starts_with(long_name, name)) {
                            string_type err;
                            detail::parse_flag_long<string_type, value_type>()(
                                match, arg_it, arg_last,
                                opts.template priv_value<option>(), flg, err);
                            if (!err.empty()) {
                                throw error_type(command.m_header + _(": ") + err);
                            }
                            if (flg.exclusive) exclusive = true;
                        }
                    }
                });
        } else if (std::regex_match(*arg_it, match, regex_type(_("-(.+)")))) {
            // short flag
            for (auto it = match[1].first; it != match[1].second; ++it) {
                auto const name = *it;
                bool exact = false;
                detail::tuple_for_each(command.m_flags, [&](auto const &flg)
                    {
                        if (detail::contains(flg.short_names, name)) {
                            if (std::exchange(exact, true)) {
                                throw error_type(
                                    command.m_header + _(": ambiguous option: -") + name);
                            }
                        }
                    });
                if (!exact) {
                    throw error_type(command.m_header + _(": unrecognized option: -") + name);
                }
                detail::tuple_for_each(command.m_flags, [&](auto const &flg)
                    {
                        using flag_type = detail::remove_cvr_t<decltype(flg)>;
                        using value_type = typename flag_type::value_type;
                        constexpr auto option = flag_type::option();
                        if (detail::contains(flg.short_names, name)) {
                            string_type err;
                            detail::parse_flag_short<string_type, value_type>()(
                                it, match[1].second, arg_it, arg_last,
                                opts.template priv_value<option>(), flg, err);
                            if (!err.empty()) {
                                throw error_type(command.m_header + _(": ") + err);
                            }
                            if (flg.exclusive) exclusive = true;
                        }
                    });
            }
        } else if (subcommand_required && !subcommand_arg) {
            // subcommand and arguments
            subcommand_arg = detail::copy_shared(*arg_it);
            argument_args.insert(argument_args.end(), std::next(arg_it), arg_last);
            break;
        } else if (order == argument_order::flexible) {
            // argument
            argument_args.push_back(*arg_it);
        } else {
            // arguments
            argument_args.insert(argument_args.end(), arg_it, arg_last);
            break;
        }
    }

    if (exclusive) return opts;

    auto argument_it = argument_args.begin();
    auto const argument_last = argument_args.end();

    if (subcommand_required) {
        if (!subcommand_arg) {
            throw error_type(command.m_header + _(": command required"));
        }
        bool exact = false;
        detail::tuple_for_each(command.m_subcommands, [&](auto const &subcmd)
            {
                if (subcmd.name == *subcommand_arg) {
                    if (std::exchange(exact, true)) {
                        throw error_type(
                            command.m_header + _(": ambiguous command: ") + *subcommand_arg);
                    }
                }
            });
        if (!exact) {
            throw error_type(command.m_header + _(": unrecognized command: ") + *subcommand_arg);
        }
        detail::tuple_for_each(command.m_subcommands, [&](auto const &subcmd)
            {
                if (subcmd.name == *subcommand_arg) {
                    using subcommand_type = std::remove_cv_t<
                        std::remove_reference_t<decltype(subcmd)>>;
                    constexpr auto option = subcommand_type::option();
                    opts.template priv_value<option>() = detail::copy_shared(
                        parse(argument_it, argument_last, subcmd.command, order));
                }
            });
        return opts;
    }

    detail::tuple_for_each(command.m_arguments, [&](auto const &arg)
        {
            using argument_type = std::remove_cv_t<std::remove_reference_t<decltype(arg)>>;
            using value_type = typename argument_type::value_type;
            constexpr auto option = argument_type::option();
            string_type err;
            detail::parse_argument<string_type, value_type>()(
                argument_it, argument_last, opts.template priv_value<option>(), arg, err);
            if (!err.empty()) {
                throw error_type(command.m_header + _(": ") + err);
            }
        });

    if (argument_it != argument_last) {
        throw error_type(command.m_header + _(": unrecognized argument: ") + *argument_it);
    }

    return opts;
}